

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<char>_>::increment
          (segment_index_iterator<std::_List_iterator<char>_> *this)

{
  uint uVar1;
  ulong uVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  pair<unsigned_long,_unsigned_long> pos;
  
  uVar2 = (this->current_).second;
  if (this->full_select_ == false) {
    peVar3 = (this->map_->index_).
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar4 = (long)(peVar3->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(peVar3->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_finish - lVar4 >> 4;
    if (uVar2 < uVar7) {
      puVar9 = (uint *)(uVar2 * 0x10 + lVar4 + 0x18);
      do {
        uVar8 = uVar2;
        if ((uVar7 - 1 == uVar8) || ((*puVar9 & this->mask_) != 0)) break;
        puVar9 = puVar9 + 4;
        uVar2 = uVar8 + 1;
      } while (uVar8 + 1 < uVar7);
      uVar7 = uVar8 + 1;
    }
    else {
      uVar7 = uVar2;
      uVar8 = (this->current_).first;
    }
  }
  else {
    peVar3 = (this->map_->index_).
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar4 = (long)(peVar3->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(peVar3->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_finish - lVar4 >> 4;
    uVar8 = uVar6;
    if (uVar6 < uVar2) {
      uVar8 = uVar2;
    }
    puVar9 = (uint *)(uVar2 * 0x10 + lVar4 + 0x18);
    uVar10 = uVar2;
    uVar5 = uVar2;
    do {
      uVar11 = uVar5 + 1;
      uVar7 = uVar8;
      if ((uVar6 <= uVar5) || (uVar10 = uVar10 + 1, uVar7 = uVar10, uVar6 == uVar11)) break;
      uVar1 = *puVar9;
      uVar7 = uVar11;
      puVar9 = puVar9 + 4;
      uVar5 = uVar11;
    } while ((uVar1 & this->mask_) == 0);
    uVar8 = uVar2;
    if (uVar7 == uVar6) {
      uVar8 = uVar7 - 1;
    }
  }
  pos.second = uVar7;
  pos.first = uVar8;
  update_current(this,pos);
  return;
}

Assistant:

void increment()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            next.first = next.second;
                            while(next.second < size()) {
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                            if(next.second == size())
                                next.first = next.second - 1;
                        }
                        else {
                            while(next.second < size()) {
                                next.first = next.second;
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                        }
                        update_current(next);
                    }